

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locgen.cpp
# Opt level: O0

void load_loc_bitmap(Am_Object *obj,char *name)

{
  Am_Wrapper *pAVar1;
  Am_Object *pAVar2;
  Am_Object local_30;
  Am_Image_Array local_28;
  Am_Image_Array icon;
  char *pathname;
  char *name_local;
  Am_Object *obj_local;
  
  icon.data = (Am_Image_Array_Data *)Am_Merge_Pathname(name);
  Am_Image_Array::Am_Image_Array(&local_28,(char *)icon.data);
  if (icon.data != (Am_Image_Array_Data *)0x0) {
    operator_delete__(icon.data);
  }
  Am_Object::Create(&local_30,(char *)&Am_Bitmap);
  pAVar1 = Am_Image_Array::operator_cast_to_Am_Wrapper_(&local_28);
  pAVar2 = Am_Object::Set(&local_30,0xb0,pAVar1,0);
  pAVar1 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Black);
  pAVar2 = Am_Object::Set(pAVar2,0x6b,pAVar1,0);
  Am_Object::operator=(obj,pAVar2);
  Am_Object::~Am_Object(&local_30);
  Am_Image_Array::~Am_Image_Array(&local_28);
  return;
}

Assistant:

void
load_loc_bitmap(Am_Object &obj, const char *name)
{
  const char *pathname = Am_Merge_Pathname(name);
  Am_Image_Array icon = Am_Image_Array(pathname);
  delete[] pathname;
  obj = Am_Bitmap.Create(name).Set(Am_IMAGE, icon).Set(Am_LINE_STYLE, Am_Black);
}